

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

Parser * __thiscall c4::yml::Parser::operator=(Parser *this,Parser *that)

{
  pfn_error p_Var1;
  Location LVar2;
  Location LVar3;
  Location loc;
  bool bVar4;
  error_flags eVar5;
  uint32_t *in_RSI;
  Parser *in_RDI;
  char msg_1 [72];
  char msg [76];
  stack<c4::yml::Parser::State,_16UL> *in_stack_fffffffffffffe78;
  Parser *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  Location *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  Location *in_stack_fffffffffffffea0;
  Location *this_00;
  char (*in_stack_fffffffffffffed0) [25];
  undefined8 uStack_128;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  csubstr in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff18;
  Parser *in_stack_ffffffffffffff20;
  undefined8 local_c0;
  Parser *pPStack_b8;
  char *local_b0;
  Location *pLStack_a8;
  char *local_a0;
  char local_98 [88];
  uint32_t *local_40;
  stack<c4::yml::Parser::State,_16UL> *local_30;
  Parser *pPStack_28;
  char *local_20;
  Location *pLStack_18;
  char *local_10;
  stack<c4::yml::Parser::State,_16UL> *local_8;
  
  local_40 = in_RSI;
  _free(in_stack_fffffffffffffe80);
  (in_RDI->m_options).flags = *local_40;
  (in_RDI->m_file).str = *(char **)(local_40 + 2);
  (in_RDI->m_file).len = *(size_t *)(local_40 + 4);
  (in_RDI->m_buf).str = *(char **)(local_40 + 6);
  (in_RDI->m_buf).len = *(size_t *)(local_40 + 8);
  in_RDI->m_root_id = *(size_t *)(local_40 + 10);
  in_RDI->m_tree = *(Tree **)(local_40 + 0xc);
  detail::stack<c4::yml::Parser::State,_16UL>::operator=
            ((stack<c4::yml::Parser::State,_16UL> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  local_8 = &in_RDI->m_stack;
  if ((in_RDI->m_stack).m_size == 0) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                       (size_t)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    loc.super_LineCol.line = in_stack_fffffffffffffee8;
    loc.super_LineCol.offset = in_stack_fffffffffffffee0;
    loc.super_LineCol.col = in_stack_fffffffffffffef0;
    loc.name = in_stack_fffffffffffffef8;
    error<25ul>(in_stack_fffffffffffffed0,loc);
    in_stack_fffffffffffffe78 = local_30;
    in_stack_fffffffffffffe80 = pPStack_28;
    in_stack_fffffffffffffe88 = local_20;
    in_stack_fffffffffffffe90 = pLStack_18;
    in_stack_fffffffffffffe98 = local_10;
  }
  in_RDI->m_state = (in_RDI->m_stack).m_stack + ((in_RDI->m_stack).m_size - 1);
  in_RDI->m_key_tag_indentation = *(size_t *)(local_40 + 0x27e);
  in_RDI->m_key_tag2_indentation = *(size_t *)(local_40 + 0x280);
  (in_RDI->m_key_tag).str = *(char **)(local_40 + 0x282);
  (in_RDI->m_key_tag).len = *(size_t *)(local_40 + 0x284);
  (in_RDI->m_key_tag2).str = *(char **)(local_40 + 0x286);
  (in_RDI->m_key_tag2).len = *(size_t *)(local_40 + 0x288);
  in_RDI->m_val_tag_indentation = *(size_t *)(local_40 + 0x28a);
  (in_RDI->m_val_tag).str = *(char **)(local_40 + 0x28c);
  (in_RDI->m_val_tag).len = *(size_t *)(local_40 + 0x28e);
  in_RDI->m_key_anchor_was_before = (bool)((byte)local_40[0x290] & 1);
  in_RDI->m_key_anchor_indentation = *(size_t *)(local_40 + 0x292);
  (in_RDI->m_key_anchor).str = *(char **)(local_40 + 0x294);
  (in_RDI->m_key_anchor).len = *(size_t *)(local_40 + 0x296);
  in_RDI->m_val_anchor_indentation = *(size_t *)(local_40 + 0x298);
  (in_RDI->m_val_anchor).str = *(char **)(local_40 + 0x29a);
  (in_RDI->m_val_anchor).len = *(size_t *)(local_40 + 0x29c);
  if (*(long *)(local_40 + 0x2a0) != 0) {
    _resize_filter_arena(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  if (in_RDI->m_newline_offsets_capacity < *(ulong *)(local_40 + 0x2a6)) {
    _resize_locations(in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
  }
  if (in_RDI->m_newline_offsets_capacity < *(ulong *)(local_40 + 0x2a6)) {
    memcpy(local_98,"check failed: m_newline_offsets_capacity >= that.m_newline_offsets_capacity",
           0x4c);
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       (size_t)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
                       (size_t)in_stack_fffffffffffffe80);
    LVar2.super_LineCol.line = (size_t)pPStack_b8;
    LVar2.super_LineCol.offset = local_c0;
    LVar2.super_LineCol.col = (size_t)local_b0;
    LVar2.name.str = (char *)pLStack_a8;
    LVar2.name.len = (size_t)local_a0;
    (*p_Var1)(local_98,0x4c,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffe80 = pPStack_b8;
    in_stack_fffffffffffffe88 = local_b0;
    in_stack_fffffffffffffe90 = pLStack_a8;
    in_stack_fffffffffffffe98 = local_a0;
  }
  if (in_RDI->m_newline_offsets_capacity < *(ulong *)(local_40 + 0x2a4)) {
    memcpy(&stack0xfffffffffffffef8,
           "check failed: m_newline_offsets_capacity >= that.m_newline_offsets_size",0x48);
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    this_00 = (Location *)&stack0xfffffffffffffef8;
    Location::Location(this_00,in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90,
                       (size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
    LVar3.super_LineCol.line = uStack_128;
    LVar3.super_LineCol.offset = (size_t)in_stack_fffffffffffffed0;
    LVar3.super_LineCol.col = in_stack_fffffffffffffee0;
    LVar3.name.str = (char *)in_stack_fffffffffffffee8;
    LVar3.name.len = in_stack_fffffffffffffef0;
    (*p_Var1)((char *)this_00,0x48,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
  }
  memcpy(in_RDI->m_newline_offsets,*(void **)(local_40 + 0x2a2),*(long *)(local_40 + 0x2a4) << 3);
  in_RDI->m_newline_offsets_size = *(size_t *)(local_40 + 0x2a4);
  (in_RDI->m_newline_offsets_buf).str = *(char **)(local_40 + 0x2a8);
  (in_RDI->m_newline_offsets_buf).len = *(size_t *)(local_40 + 0x2aa);
  return in_RDI;
}

Assistant:

Parser& Parser::operator=(Parser const& that)
{
    _free();
    m_options = (that.m_options);
    m_file = (that.m_file);
    m_buf = (that.m_buf);
    m_root_id = (that.m_root_id);
    m_tree = (that.m_tree);
    m_stack = that.m_stack;
    m_state = &m_stack.top();
    m_key_tag_indentation = (that.m_key_tag_indentation);
    m_key_tag2_indentation = (that.m_key_tag2_indentation);
    m_key_tag = (that.m_key_tag);
    m_key_tag2 = (that.m_key_tag2);
    m_val_tag_indentation = (that.m_val_tag_indentation);
    m_val_tag = (that.m_val_tag);
    m_key_anchor_was_before = (that.m_key_anchor_was_before);
    m_key_anchor_indentation = (that.m_key_anchor_indentation);
    m_key_anchor = (that.m_key_anchor);
    m_val_anchor_indentation = (that.m_val_anchor_indentation);
    m_val_anchor = (that.m_val_anchor);
    if(that.m_filter_arena.len > 0)
        _resize_filter_arena(that.m_filter_arena.len);
    if(that.m_newline_offsets_capacity > m_newline_offsets_capacity)
        _resize_locations(that.m_newline_offsets_capacity);
    _RYML_CB_CHECK(m_stack.m_callbacks, m_newline_offsets_capacity >= that.m_newline_offsets_capacity);
    _RYML_CB_CHECK(m_stack.m_callbacks, m_newline_offsets_capacity >= that.m_newline_offsets_size);
    memcpy(m_newline_offsets, that.m_newline_offsets, that.m_newline_offsets_size * sizeof(size_t));
    m_newline_offsets_size = that.m_newline_offsets_size;
    m_newline_offsets_buf = that.m_newline_offsets_buf;
    return *this;
}